

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cpp
# Opt level: O3

void argo::operator<<(string *s,json *j)

{
  stream_writer w;
  stringstream ss;
  undefined1 local_1d8 [24];
  char *local_1c0;
  int local_1b8;
  stream_writer local_1b0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  stream_writer::stream_writer(&local_1b0,local_190);
  local_1d8._8_8_ = " ";
  local_1d8._16_8_ = "";
  local_1c0 = " ";
  local_1b8 = 0;
  local_1d8._0_8_ = &local_1b0;
  unparser::unparse((unparser *)local_1d8,j,0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)s,(string *)local_1d8);
  if ((stream_writer *)local_1d8._0_8_ != (stream_writer *)(local_1d8 + 0x10)) {
    operator_delete((void *)local_1d8._0_8_);
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

void NAMESPACE::operator<<(string &s, const json &j)
{
    stringstream ss;
    unparser::unparse(ss, j);
    s = ss.str();
}